

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frattracer.cpp
# Opt level: O1

void __thiscall
CaDiCaL::FratTracer::frat_delete_clause
          (FratTracer *this,uint64_t id,vector<int,_std::allocator<int>_> *clause)

{
  uint64_t *puVar1;
  uint *puVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  FILE *__stream;
  File *pFVar7;
  int *external_lit;
  uint64_t uVar8;
  uint *puVar9;
  uint uVar6;
  
  pFVar7 = this->file;
  if (this->binary == true) {
    iVar4 = putc_unlocked(100,(FILE *)pFVar7->file);
    if (iVar4 != -1) {
      pFVar7->_bytes = pFVar7->_bytes + 1;
    }
  }
  else {
    File::put(pFVar7,"d ");
  }
  if (this->binary == true) {
    uVar8 = id;
    if (0x7f < id) {
      do {
        pFVar7 = this->file;
        iVar4 = putc_unlocked((uint)uVar8 & 0xff | 0x80,(FILE *)pFVar7->file);
        if (iVar4 != -1) {
          puVar1 = &pFVar7->_bytes;
          *puVar1 = *puVar1 + 1;
        }
        id = uVar8 >> 7;
        bVar3 = 0x3fff < uVar8;
        uVar8 = id;
      } while (bVar3);
    }
    pFVar7 = this->file;
    iVar4 = putc_unlocked((int)id,(FILE *)pFVar7->file);
    if (iVar4 != -1) {
      puVar1 = &pFVar7->_bytes;
      *puVar1 = *puVar1 + 1;
    }
  }
  else {
    File::put(this->file,id);
    File::put(this->file,"  ");
  }
  puVar2 = (uint *)(clause->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
  for (puVar9 = (uint *)(clause->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start; puVar9 != puVar2; puVar9 = puVar9 + 1) {
    if (this->binary == true) {
      uVar5 = *puVar9;
      uVar6 = -uVar5;
      if (0 < (int)uVar5) {
        uVar6 = uVar5;
      }
      uVar5 = uVar6 << 1 | uVar5 >> 0x1f;
      uVar6 = uVar5;
      if (0x7f < uVar5) {
        do {
          pFVar7 = this->file;
          iVar4 = putc_unlocked(uVar6 & 0xff | 0x80,(FILE *)pFVar7->file);
          if (iVar4 != -1) {
            puVar1 = &pFVar7->_bytes;
            *puVar1 = *puVar1 + 1;
          }
          uVar5 = uVar6 >> 7;
          bVar3 = 0x3fff < uVar6;
          uVar6 = uVar5;
        } while (bVar3);
      }
      pFVar7 = this->file;
      __stream = (FILE *)pFVar7->file;
    }
    else {
      File::put(this->file,*puVar9);
      pFVar7 = this->file;
      __stream = (FILE *)pFVar7->file;
      uVar5 = 0x20;
    }
    iVar4 = putc_unlocked(uVar5,__stream);
    if (iVar4 != -1) {
      pFVar7->_bytes = pFVar7->_bytes + 1;
    }
  }
  pFVar7 = this->file;
  if (this->binary == false) {
    File::put(pFVar7,"0\n");
    return;
  }
  iVar4 = putc_unlocked(0,(FILE *)pFVar7->file);
  if (iVar4 != -1) {
    pFVar7->_bytes = pFVar7->_bytes + 1;
  }
  return;
}

Assistant:

void FratTracer::frat_delete_clause (uint64_t id,
                                     const vector<int> &clause) {
  if (binary)
    file->put ('d');
  else
    file->put ("d ");
  if (binary)
    put_binary_id (id);
  else
    file->put (id), file->put ("  ");
  for (const auto &external_lit : clause)
    if (binary)
      put_binary_lit (external_lit);
    else
      file->put (external_lit), file->put (' ');
  if (binary)
    put_binary_zero ();
  else
    file->put ("0\n");
}